

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,StringTree *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t __n_00;
  long lVar3;
  size_t result_2;
  char *pcVar4;
  size_t result;
  size_t sVar5;
  String local_c8;
  char *local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  char *local_80;
  char *local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  ArrayPtr<const_char> *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_a8 = (this->text).content.ptr;
  sStack_a0 = params->size_;
  local_98 = params_1->size_;
  sStack_90 = params_2->size_;
  local_88 = params_3->size_;
  local_80 = params_4->ptr;
  local_78 = (params_5->text).content.ptr;
  sStack_70 = params_6->size_;
  local_68 = params_7->size_;
  sStack_60 = params_8->size_;
  local_58 = params_9->size_;
  sVar5 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_a8 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x58);
  __return_storage_ptr__->size_ = sVar5;
  local_80 = (char *)0x0;
  sVar5 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_a8 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x58);
  local_50 = params;
  local_48 = params_1;
  local_40 = params_2;
  local_38 = params_3;
  heapString(&local_c8,sVar5);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar4,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_c8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_c8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_c8.content.disposer;
  sVar5 = 0;
  local_88 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = (char *)0x0;
  sStack_a0 = 0;
  local_80 = (char *)0x1;
  local_78 = (char *)0x0;
  sStack_70 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_a8 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x58);
  local_c8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar5,sVar5,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_c8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_c8.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar5 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_c8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_c8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_c8.content.disposer;
  pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar4,(void *)this->size_,(size_t)__n);
    pcVar4 = pcVar4 + (long)__n;
  }
  __n_00 = local_50->size_;
  if (__n_00 != 0) {
    memcpy(pcVar4,local_50->ptr,__n_00);
    pcVar4 = pcVar4 + __n_00;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar4,0,local_48,local_40,local_38,(StringTree *)params_4,
             (ArrayPtr<const_char> *)params_5,params_6,params_7,params_8,params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}